

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

xmlParserInputPtr xmlCtxtPopInput(xmlParserCtxtPtr ctxt)

{
  int iVar1;
  xmlParserInputPtr *ppxVar2;
  uint uVar3;
  xmlParserInputPtr pxVar4;
  
  if (ctxt != (xmlParserCtxtPtr)0x0) {
    iVar1 = ctxt->inputNr;
    if (0 < (long)iVar1) {
      uVar3 = iVar1 - 1;
      ctxt->inputNr = uVar3;
      ppxVar2 = ctxt->inputTab;
      if (iVar1 == 1) {
        pxVar4 = (xmlParserInputPtr)0x0;
      }
      else {
        pxVar4 = ppxVar2[(long)iVar1 + -2];
      }
      ctxt->input = pxVar4;
      pxVar4 = ppxVar2[uVar3];
      ppxVar2[uVar3] = (xmlParserInputPtr)0x0;
      return pxVar4;
    }
  }
  return (xmlParserInputPtr)0x0;
}

Assistant:

xmlParserInputPtr
xmlCtxtPopInput(xmlParserCtxtPtr ctxt)
{
    xmlParserInputPtr ret;

    if (ctxt == NULL)
        return(NULL);
    if (ctxt->inputNr <= 0)
        return (NULL);
    ctxt->inputNr--;
    if (ctxt->inputNr > 0)
        ctxt->input = ctxt->inputTab[ctxt->inputNr - 1];
    else
        ctxt->input = NULL;
    ret = ctxt->inputTab[ctxt->inputNr];
    ctxt->inputTab[ctxt->inputNr] = NULL;
    return (ret);
}